

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

BOOL __thiscall Js::JavascriptStackWalker::IsCallerGlobalFunction(JavascriptStackWalker *this)

{
  FunctionInfo *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CallInfo CVar4;
  JavascriptFunction *this_01;
  ParseableFunctionInfo *pPVar5;
  undefined4 *puVar6;
  uint uVar7;
  
  CVar4 = GetCallInfo(this,true);
  this_01 = GetCurrentFunction(this,true);
  bVar2 = IsLibraryStackFrameEnabled(this->scriptContext);
  if ((bVar2) && (BVar3 = JavascriptFunction::IsScriptFunction(this_01), BVar3 == 0)) {
    uVar7 = 0;
  }
  else {
    this_00 = (this_01->functionInfo).ptr;
    if (((this_00->functionBodyImpl).ptr == (FunctionProxy *)0x0) ||
       ((this_00->attributes & DeferredDeserialize) != None)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0xf8,"(0)",
                                  "Here we should only have script functions which were already parsed/deserialized."
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
      if (((ulong)CVar4 & 0xffffff) == 0) {
        return 1;
      }
    }
    else {
      pPVar5 = FunctionInfo::GetParseableFunctionInfo(this_00);
      if (((pPVar5->super_FunctionProxy).field_0x46 & 0x10) != 0) {
        return 1;
      }
    }
    uVar7 = (uint)((ulong)CVar4 >> 0x1a) & 1;
  }
  return uVar7;
}

Assistant:

BOOL JavascriptStackWalker::IsCallerGlobalFunction() const
    {
        const CallInfo callInfo = this->GetCallInfo();

        JavascriptFunction* function = this->GetCurrentFunction();
        if (IsLibraryStackFrameEnabled(this->scriptContext) && !function->IsScriptFunction())
        {
            return false; // native library code can't be global function
        }

        FunctionInfo* funcInfo = function->GetFunctionInfo();
        if (funcInfo->HasParseableInfo())
        {
            return funcInfo->GetParseableFunctionInfo()->GetIsGlobalFunc() || IsEval(callInfo);
        }
        else
        {
            AssertMsg(FALSE, "Here we should only have script functions which were already parsed/deserialized.");
            return callInfo.Count == 0 || IsEval(callInfo);
        }
    }